

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

bool __thiscall IR::IntConstOpnd::IsEqualInternal(IntConstOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->super_Opnd).m_kind != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x5d5,"(m_kind == OpndKindIntConst)","m_kind == OpndKindIntConst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((opnd->m_kind == OpndKindIntConst) && ((this->super_Opnd).m_type == opnd->m_type)) {
    bVar2 = (_func_int **)(this->super_EncodableOpnd<long>).m_value == opnd[1]._vptr_Opnd;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
IntConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindIntConst);
    if (!opnd->IsIntConstOpnd() || this->GetType() != opnd->GetType())
    {
        return false;
    }

    return m_value == opnd->AsIntConstOpnd()->m_value;
}